

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.tpl.h
# Opt level: O1

double __thiscall
r_exec::Object<r_code::LObject,_r_exec::LObject>::get_psln_thr
          (Object<r_code::LObject,_r_exec::LObject> *this)

{
  mutex *__mutex;
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  float fVar4;
  
  __mutex = &this->m_pslnThrMutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    (*(this->super_LObject).super_Code.super__Object._vptr__Object[4])(this,0);
    bVar1 = r_code::Atom::getAtomCount();
    (*(this->super_LObject).super_Code.super__Object._vptr__Object[4])(this,(ulong)bVar1);
    fVar4 = (float)r_code::Atom::asFloat();
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return (double)fVar4;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

double Object<C, U>::get_psln_thr()
{
    std::lock_guard<std::mutex> guard(m_pslnThrMutex);
    float r = this->code(this->code(0).getAtomCount()).asFloat(); // psln is always the last member of an object.
    return r;
}